

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGParseStart(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlRelaxNGDefinePtr_conflict pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlRelaxNGDefinePtr *ppxVar4;
  char *msg;
  xmlNs *pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  int iVar7;
  
  iVar7 = -1;
  if ((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) {
LAB_0017c109:
    pxVar3 = xmlRelaxNGParsePatterns(ctxt,nodes,1);
  }
  else {
    iVar2 = xmlStrEqual(nodes->name,"empty");
    pxVar5 = nodes->ns;
    if (iVar2 == 0) {
LAB_0017c096:
      if ((((pxVar5 == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
          (iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"notAllowed"), iVar2 == 0)) ||
         (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar2 == 0)) goto LAB_0017c109;
      pxVar3 = xmlRelaxNGNewDefine(ctxt,nodes);
      if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return -1;
      }
      pxVar3->type = XML_RELAXNG_NOT_ALLOWED;
      if (nodes->children == (_xmlNode *)0x0) goto LAB_0017c11a;
      msg = "element notAllowed is not empty\n";
      iVar2 = 0x41f;
    }
    else {
      iVar2 = xmlStrEqual(pxVar5->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar2 == 0) {
        pxVar5 = nodes->ns;
        goto LAB_0017c096;
      }
      pxVar3 = xmlRelaxNGNewDefine(ctxt,nodes);
      if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return -1;
      }
      pxVar3->type = XML_RELAXNG_EMPTY;
      if (nodes->children == (_xmlNode *)0x0) goto LAB_0017c11a;
      msg = "element empty is not empty\n";
      iVar2 = 0x400;
    }
    xmlRngPErr(ctxt,nodes,iVar2,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  }
LAB_0017c11a:
  pxVar1 = ctxt->grammar->start;
  if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) {
    ppxVar4 = &ctxt->grammar->start;
  }
  else {
    do {
      pxVar6 = pxVar1;
      pxVar1 = pxVar6->next;
    } while (pxVar1 != (xmlRelaxNGDefinePtr)0x0);
    ppxVar4 = &pxVar6->next;
  }
  *ppxVar4 = pxVar3;
  if (nodes->next == (xmlNodePtr)0x0) {
    iVar7 = 0;
  }
  else {
    xmlRngPErr(ctxt,nodes->next,0x451,"start more than one children\n",(xmlChar *)0x0,(xmlChar *)0x0
              );
  }
  return iVar7;
}

Assistant:

static int
xmlRelaxNGParseStart(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes)
{
    int ret = 0;
    xmlRelaxNGDefinePtr def = NULL, last;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY, "start has no children\n",
                   NULL, NULL);
        return (-1);
    }
    if (IS_RELAXNG(nodes, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, nodes);
        if (def == NULL)
            return (-1);
        def->type = XML_RELAXNG_EMPTY;
        if (nodes->children != NULL) {
            xmlRngPErr(ctxt, nodes, XML_RNGP_EMPTY_CONTENT,
                       "element empty is not empty\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(nodes, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, nodes);
        if (def == NULL)
            return (-1);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (nodes->children != NULL) {
            xmlRngPErr(ctxt, nodes, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "element notAllowed is not empty\n", NULL, NULL);
        }
    } else {
        def = xmlRelaxNGParsePatterns(ctxt, nodes, 1);
    }
    if (ctxt->grammar->start != NULL) {
        last = ctxt->grammar->start;
        while (last->next != NULL)
            last = last->next;
        last->next = def;
    } else {
        ctxt->grammar->start = def;
    }
    nodes = nodes->next;
    if (nodes != NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_START_CONTENT,
                   "start more than one children\n", NULL, NULL);
        return (-1);
    }
    return (ret);
}